

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

void __thiscall
CVmObjVector::new_live_iterator(CVmObjVector *this,vm_val_t *retval,vm_val_t *self_val)

{
  vm_obj_id_t obj;
  long in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *coll;
  
  coll = in_RSI;
  get_element_count((CVmObjVector *)0x3a24e0);
  obj = CVmObjIterIdx::create_for_coll(coll,in_RDX,(long)in_RSI);
  vm_val_t::set_obj(in_RSI,obj);
  return;
}

Assistant:

void CVmObjVector::new_live_iterator(VMG_ vm_val_t *retval,
                                     const vm_val_t *self_val)
{
    /* 
     *   Set up a new indexed iterator object.  The first valid index for a
     *   vector is always 1, and the last valid index is the same as the
     *   number of elements.  Since we want a "live" iterator, create the
     *   iterator with a direct reference to the vector.  
     */
    retval->set_obj(CVmObjIterIdx::create_for_coll(vmg_ self_val,
        1, get_element_count()));
}